

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_mllr.c
# Opt level: O0

int ps_mllr_free(ps_mllr_t *mllr)

{
  int iVar1;
  int local_1c;
  int i;
  ps_mllr_t *mllr_local;
  
  if (mllr == (ps_mllr_t *)0x0) {
    mllr_local._4_4_ = 0;
  }
  else {
    iVar1 = mllr->refcnt + -1;
    mllr->refcnt = iVar1;
    if (iVar1 < 1) {
      for (local_1c = 0; local_1c < mllr->n_feat; local_1c = local_1c + 1) {
        if (mllr->A != (float32 ****)0x0) {
          ckd_free_3d(mllr->A[local_1c]);
        }
        if (mllr->b != (float32 ***)0x0) {
          ckd_free_2d(mllr->b[local_1c]);
        }
        if (mllr->h != (float32 ***)0x0) {
          ckd_free_2d(mllr->h[local_1c]);
        }
      }
      ckd_free(mllr->veclen);
      ckd_free(mllr->A);
      ckd_free(mllr->b);
      ckd_free(mllr->h);
      ckd_free(mllr);
      mllr_local._4_4_ = 0;
    }
    else {
      mllr_local._4_4_ = mllr->refcnt;
    }
  }
  return mllr_local._4_4_;
}

Assistant:

int
ps_mllr_free(ps_mllr_t *mllr)
{
    int i;

    if (mllr == NULL)
        return 0;
    if (--mllr->refcnt > 0)
        return mllr->refcnt;

    for (i = 0; i < mllr->n_feat; ++i) {
        if (mllr->A)
            ckd_free_3d(mllr->A[i]);
        if (mllr->b)
            ckd_free_2d(mllr->b[i]);
        if (mllr->h)
            ckd_free_2d(mllr->h[i]);
    }
    ckd_free(mllr->veclen);
    ckd_free(mllr->A);
    ckd_free(mllr->b);
    ckd_free(mllr->h);
    ckd_free(mllr);

    return 0;
}